

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShowLabel::mouseMoveEvent(QColorShowLabel *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  QMimeData *this_00;
  QDrag *this_01;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QPainter p;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mousePressed == true) {
    QVar5 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_58._8_8_ = QVar5.yp;
    local_58.shared = (PrivateShared *)QVar5.xp;
    QVar2 = QPointF::toPoint((QPointF *)&local_58);
    iVar3 = (this->pressPos).xp.m_i - QVar2.xp.m_i;
    iVar4 = (this->pressPos).yp.m_i - QVar2.yp.m_i;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = QApplication::startDragDistance();
    if (iVar4 < iVar3 + iVar1) {
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      QColor::operator_cast_to_QVariant((QVariant *)&local_58,&this->col);
      QMimeData::setColorData((QVariant *)this_00);
      ::QVariant::~QVariant((QVariant *)&local_58);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58.data,0x1e,0x14);
      QPixmap::fill((QColor *)local_58.data);
      _p = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&p,(QPaintDevice *)local_58.data);
      iVar1 = QPixmap::width();
      iVar3 = QPixmap::height();
      QPainter::drawRect(&p,0,0,iVar1 + -1,iVar3 + -1);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,(QObject *)this);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      this->mousePressed = false;
      QDrag::exec(this_01,1);
      QPainter::~QPainter(&p);
      QPixmap::~QPixmap((QPixmap *)local_58.data);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShowLabel::mouseMoveEvent(QMouseEvent *e)
{
#if !QT_CONFIG(draganddrop)
    Q_UNUSED(e);
#else
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(30, 20);
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}